

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O3

void UI::execute_rotate(int *argc,char **argv)

{
  _Alloc_hider _Var1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  undefined8 uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  pointer pcVar7;
  double theta_y;
  double theta_z;
  double ori_z;
  double ori_y;
  double ori_x;
  string outfile_path;
  double theta_x;
  string input_path;
  geofile primary_geofile;
  allocator<char> local_469;
  pointer local_468;
  string local_460;
  allocator<char> local_43b;
  allocator<char> local_43a;
  allocator<char> local_439;
  pointer local_438;
  pointer local_430;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e8;
  long local_2e0;
  size_type local_2d8 [2];
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  geofile local_228;
  
  if (*argc != 0xb) {
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"Error: incorrect argument count.","");
    print_ln(&local_268);
    local_2e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p == &local_268.field_2) {
      return;
    }
    goto LAB_0010efad;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,argv[3],(allocator<char> *)&local_228);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,argv[4],(allocator<char> *)&local_228);
  GEO::geofile::geofile(&local_228);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_460,argv[5],(allocator<char> *)&local_438);
  bVar2 = GEO::is_e_notation(&local_460);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_428,argv[6],(allocator<char> *)&local_430);
    bVar2 = GEO::is_e_notation(&local_428);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,argv[7],&local_469);
      bVar2 = GEO::is_e_notation(&local_3c8);
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,argv[8],&local_439);
        bVar2 = GEO::is_e_notation(&local_3e8);
        if (bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_408,argv[9],&local_43a);
          bVar2 = GEO::is_e_notation(&local_408);
          if (bVar2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_308,argv[10],&local_43b);
            bVar2 = GEO::is_e_notation(&local_308);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_308._M_dataplus._M_p != &local_308.field_2) {
              operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            bVar2 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar2 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar2 = false;
  }
  paVar6 = &local_460.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != paVar6) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  if (bVar2 == false) {
LAB_0010e9ff:
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_388,"Error: Shifting parameters unrecognized. Terminating.","");
    print_ln(&local_388);
    local_248._M_dataplus._M_p = local_388._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
LAB_0010ef5e:
      operator_delete(local_248._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
LAB_0010ef66:
    GEO::geofile::~geofile(&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    local_268.field_2._M_allocated_capacity = local_2d8[0];
    if (local_2e8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8) {
      return;
    }
LAB_0010efad:
    operator_delete(local_2e8,local_268.field_2._M_allocated_capacity + 1);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_460,argv[5],(allocator<char> *)&local_3e8);
  _Var1._M_p = local_460._M_dataplus._M_p;
  piVar4 = __errno_location();
  iVar3 = *piVar4;
  *piVar4 = 0;
  pcVar7 = (pointer)strtod(_Var1._M_p,(char **)&local_428);
  if (local_428._M_dataplus._M_p == _Var1._M_p) {
    std::__throw_invalid_argument("stod");
LAB_0010efd3:
    std::__throw_invalid_argument("stod");
LAB_0010efdf:
    std::__throw_invalid_argument("stod");
LAB_0010efeb:
    std::__throw_invalid_argument("stod");
  }
  else {
    if (*piVar4 == 0) {
      *piVar4 = iVar3;
    }
    else if (*piVar4 == 0x22) {
      std::__throw_out_of_range("stod");
      goto LAB_0010e9ff;
    }
    local_3c8._M_dataplus._M_p = pcVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != paVar6) {
      local_468 = pcVar7;
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
      local_3c8._M_dataplus._M_p = local_468;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,argv[6],(allocator<char> *)&local_408);
    _Var1._M_p = local_460._M_dataplus._M_p;
    iVar3 = *piVar4;
    *piVar4 = 0;
    pcVar7 = (pointer)strtod(local_460._M_dataplus._M_p,(char **)&local_428);
    if (local_428._M_dataplus._M_p == _Var1._M_p) goto LAB_0010efd3;
    if (*piVar4 == 0) {
LAB_0010ead4:
      *piVar4 = iVar3;
    }
    else if (*piVar4 == 0x22) {
      pcVar7 = (pointer)std::__throw_out_of_range("stod");
      goto LAB_0010ead4;
    }
    local_3e8._M_dataplus._M_p = pcVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != paVar6) {
      local_468 = pcVar7;
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
      local_3e8._M_dataplus._M_p = local_468;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,argv[7],(allocator<char> *)&local_308);
    _Var1._M_p = local_460._M_dataplus._M_p;
    iVar3 = *piVar4;
    *piVar4 = 0;
    pcVar7 = (pointer)strtod(local_460._M_dataplus._M_p,(char **)&local_428);
    if (local_428._M_dataplus._M_p == _Var1._M_p) goto LAB_0010efdf;
    if (*piVar4 == 0) {
LAB_0010eb5a:
      *piVar4 = iVar3;
    }
    else if (*piVar4 == 0x22) {
      pcVar7 = (pointer)std::__throw_out_of_range("stod");
      goto LAB_0010eb5a;
    }
    local_408._M_dataplus._M_p = pcVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != paVar6) {
      local_468 = pcVar7;
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
      local_408._M_dataplus._M_p = local_468;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,argv[8],(allocator<char> *)&local_438);
    _Var1._M_p = local_460._M_dataplus._M_p;
    iVar3 = *piVar4;
    *piVar4 = 0;
    pcVar7 = (pointer)strtod(local_460._M_dataplus._M_p,(char **)&local_428);
    if (local_428._M_dataplus._M_p == _Var1._M_p) goto LAB_0010efeb;
    if (*piVar4 == 0) {
LAB_0010ebda:
      *piVar4 = iVar3;
    }
    else if (*piVar4 == 0x22) {
      pcVar7 = (pointer)std::__throw_out_of_range("stod");
      goto LAB_0010ebda;
    }
    local_308._M_dataplus._M_p = pcVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != paVar6) {
      local_468 = pcVar7;
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
      local_308._M_dataplus._M_p = local_468;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,argv[9],(allocator<char> *)&local_430);
    _Var1._M_p = local_460._M_dataplus._M_p;
    iVar3 = *piVar4;
    *piVar4 = 0;
    pcVar7 = (pointer)strtod(local_460._M_dataplus._M_p,(char **)&local_428);
    if (local_428._M_dataplus._M_p != _Var1._M_p) {
      if (*piVar4 == 0) {
LAB_0010ec65:
        *piVar4 = iVar3;
      }
      else if (*piVar4 == 0x22) {
        pcVar7 = (pointer)std::__throw_out_of_range("stod");
        goto LAB_0010ec65;
      }
      local_438 = pcVar7;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_dataplus._M_p != &local_460.field_2) {
        local_468 = pcVar7;
        operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
        local_438 = local_468;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,argv[10],&local_469);
      _Var1._M_p = local_460._M_dataplus._M_p;
      iVar3 = *piVar4;
      *piVar4 = 0;
      local_430 = (pointer)strtod(local_460._M_dataplus._M_p,(char **)&local_428);
      if (local_428._M_dataplus._M_p == _Var1._M_p) goto LAB_0010f003;
      if (*piVar4 == 0) {
LAB_0010ece5:
        *piVar4 = iVar3;
      }
      else if (*piVar4 == 0x22) {
        local_430 = (pointer)std::__throw_out_of_range("stod");
        goto LAB_0010ece5;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_dataplus._M_p != &local_460.field_2) {
        local_468 = local_430;
        operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
        local_430 = local_468;
      }
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_328,local_2e8,local_2e8->_M_local_buf + local_2e0);
      iVar3 = GEO::geofile::import_geofile(&local_228,&local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      if (iVar3 == 0) {
        iVar3 = GEO::geofile::rotate_data
                          (&local_228,(double *)&local_3c8,(double *)&local_3e8,(double *)&local_408
                           ,(double *)&local_308,(double *)&local_438,(double *)&local_430);
        if (iVar3 == 0) {
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_348,"Rotation completed.","");
          print_ln(&local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_368,local_3a8._M_dataplus._M_p,
                     local_3a8._M_dataplus._M_p + local_3a8._M_string_length);
          iVar3 = GEO::geofile::export_geofile(&local_228,&local_368);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
          }
          if (iVar3 == 0) {
            std::operator+(&local_248,"File exported as ",&local_3a8);
            print_ln(&local_248);
            paVar6 = &local_248.field_2;
          }
          else {
            paVar6 = &local_288.field_2;
            local_288._M_dataplus._M_p = (pointer)paVar6;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_288,"Error: Export failed.","");
            print_ln(&local_288);
            local_248._M_dataplus._M_p = local_288._M_dataplus._M_p;
          }
        }
        else {
          paVar6 = &local_2a8.field_2;
          local_2a8._M_dataplus._M_p = (pointer)paVar6;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2a8,"Error: Translation failed.","");
          print_ln(&local_2a8);
          local_248._M_dataplus._M_p = local_2a8._M_dataplus._M_p;
        }
      }
      else {
        paVar6 = &local_2c8.field_2;
        local_2c8._M_dataplus._M_p = (pointer)paVar6;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2c8,"Import of geofile failed.","");
        print_ln(&local_2c8);
        local_248._M_dataplus._M_p = local_2c8._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar6) {
        local_388.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        goto LAB_0010ef5e;
      }
      goto LAB_0010ef66;
    }
  }
  std::__throw_invalid_argument("stod");
LAB_0010f003:
  uVar5 = std::__throw_invalid_argument("stod");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  GEO::geofile::~geofile(&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if (local_2e8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8) {
    operator_delete(local_2e8,local_2d8[0] + 1);
  }
  _Unwind_Resume(uVar5);
}

Assistant:

void UI::execute_rotate(int &argc, char *argv[])
{
    if (argc!=11)
    {
        print_ln("Error: incorrect argument count.");
    }
    else
    {
        std::string input_path   = argv[3];
        std::string outfile_path = argv[4];
        GEO::geofile primary_geofile;
        if ((GEO::is_e_notation(argv[5]))&&
            (GEO::is_e_notation(argv[6]))&&
            (GEO::is_e_notation(argv[7]))&&
            (GEO::is_e_notation(argv[8]))&&
            (GEO::is_e_notation(argv[9]))&&
            (GEO::is_e_notation(argv[10])))
        {
            double ori_x = std::stod(argv[5]);
            double ori_y = std::stod(argv[6]);
            double ori_z = std::stod(argv[7]);
            double theta_x = std::stod(argv[8]);
            double theta_y = std::stod(argv[9]);
            double theta_z = std::stod(argv[10]);
            if(primary_geofile.import_geofile(input_path)==EXIT_SUCCESS)
            {
                if(primary_geofile.rotate_data( ori_x,   ori_y,   ori_z,
                                                theta_x, theta_y, theta_z)==EXIT_SUCCESS)
                {
                    print_ln("Rotation completed.");
                    if(primary_geofile.export_geofile(outfile_path)==EXIT_SUCCESS)
                        print_ln(("File exported as "+outfile_path));
                    else
                        print_ln("Error: Export failed.");
                }
                else
                    print_ln("Error: Translation failed.");
            }
            else
                print_ln("Import of geofile failed.");
        }
        else
            print_ln("Error: Shifting parameters unrecognized. Terminating.");
    }
}